

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

void printKTX2Header(KTX_header2 *pHeader)

{
  int iVar1;
  char *pcVar2;
  long in_RDI;
  char *scSchemeStr;
  char *vkFormatStr;
  _Bool in_stack_0000001f;
  ktx_uint8_t *in_stack_00000020;
  
  fprintf(_stdout,"identifier: ");
  printIdentifier(in_stack_00000020,in_stack_0000001f);
  fprintf(_stdout,"\n");
  pcVar2 = vkFormatString(*(VkFormat *)(in_RDI + 0xc));
  iVar1 = strcmp(pcVar2,"VK_UNKNOWN_FORMAT");
  if (iVar1 == 0) {
    fprintf(_stdout,"vkFormat: 0x%08X\n",(ulong)*(uint *)(in_RDI + 0xc));
  }
  else {
    fprintf(_stdout,"vkFormat: %s\n",pcVar2);
  }
  fprintf(_stdout,"typeSize: %u\n",(ulong)*(uint *)(in_RDI + 0x10));
  fprintf(_stdout,"pixelWidth: %u\n",(ulong)*(uint *)(in_RDI + 0x14));
  fprintf(_stdout,"pixelHeight: %u\n",(ulong)*(uint *)(in_RDI + 0x18));
  fprintf(_stdout,"pixelDepth: %u\n",(ulong)*(uint *)(in_RDI + 0x1c));
  fprintf(_stdout,"layerCount: %u\n",(ulong)*(uint *)(in_RDI + 0x20));
  fprintf(_stdout,"faceCount: %u\n",(ulong)*(uint *)(in_RDI + 0x24));
  fprintf(_stdout,"levelCount: %u\n",(ulong)*(uint *)(in_RDI + 0x28));
  pcVar2 = ktxSupercompressionSchemeString(*(ktxSupercmpScheme *)(in_RDI + 0x2c));
  iVar1 = strcmp(pcVar2,"Invalid scheme value");
  if (iVar1 == 0) {
    fprintf(_stdout,"supercompressionScheme: Invalid scheme (0x%X)\n",
            (ulong)*(uint *)(in_RDI + 0x2c));
  }
  else {
    iVar1 = strcmp(pcVar2,"Vendor or reserved scheme");
    if (iVar1 == 0) {
      fprintf(_stdout,"supercompressionScheme: Vendor or reserved scheme (0x%X)\n",
              (ulong)*(uint *)(in_RDI + 0x2c));
    }
    else {
      fprintf(_stdout,"supercompressionScheme: %s\n",pcVar2);
    }
  }
  fprintf(_stdout,"dataFormatDescriptor.byteOffset: %#x\n",(ulong)*(uint *)(in_RDI + 0x30));
  fprintf(_stdout,"dataFormatDescriptor.byteLength: %u\n",(ulong)*(uint *)(in_RDI + 0x34));
  fprintf(_stdout,"keyValueData.byteOffset: %#x\n",(ulong)*(uint *)(in_RDI + 0x38));
  fprintf(_stdout,"keyValueData.byteLength: %u\n",(ulong)*(uint *)(in_RDI + 0x3c));
  fprintf(_stdout,"supercompressionGlobalData.byteOffset: %#lx\n",*(undefined8 *)(in_RDI + 0x40));
  fprintf(_stdout,"supercompressionGlobalData.byteLength: %ld\n",*(undefined8 *)(in_RDI + 0x48));
  return;
}

Assistant:

void
printKTX2Header(KTX_header2* pHeader)
{
    fprintf(stdout, "identifier: ");
    printIdentifier(pHeader->identifier, false);
    fprintf(stdout, "\n");
    const char* vkFormatStr = vkFormatString(pHeader->vkFormat);
    if (strcmp(vkFormatStr, "VK_UNKNOWN_FORMAT") == 0)
        fprintf(stdout, "vkFormat: 0x%08X\n", (uint32_t) pHeader->vkFormat);
    else
        fprintf(stdout, "vkFormat: %s\n", vkFormatStr);
    fprintf(stdout, "typeSize: %u\n", pHeader->typeSize);
    fprintf(stdout, "pixelWidth: %u\n", pHeader->pixelWidth);
    fprintf(stdout, "pixelHeight: %u\n", pHeader->pixelHeight);
    fprintf(stdout, "pixelDepth: %u\n", pHeader->pixelDepth);
    fprintf(stdout, "layerCount: %u\n",
            pHeader->layerCount);
    fprintf(stdout, "faceCount: %u\n", pHeader->faceCount);
    fprintf(stdout, "levelCount: %u\n", pHeader->levelCount);
    const char* scSchemeStr = ktxSupercompressionSchemeString(pHeader->supercompressionScheme);
    if (strcmp(scSchemeStr, "Invalid scheme value") == 0)
        fprintf(stdout, "supercompressionScheme: Invalid scheme (0x%X)\n", (uint32_t) pHeader->supercompressionScheme);
    else if (strcmp(scSchemeStr, "Vendor or reserved scheme") == 0)
        fprintf(stdout, "supercompressionScheme: Vendor or reserved scheme (0x%X)\n", (uint32_t) pHeader->supercompressionScheme);
    else
        fprintf(stdout, "supercompressionScheme: %s\n", scSchemeStr);
    fprintf(stdout, "dataFormatDescriptor.byteOffset: %#x\n",
            pHeader->dataFormatDescriptor.byteOffset);
    fprintf(stdout, "dataFormatDescriptor.byteLength: %u\n",
            pHeader->dataFormatDescriptor.byteLength);
    fprintf(stdout, "keyValueData.byteOffset: %#x\n", pHeader->keyValueData.byteOffset);
    fprintf(stdout, "keyValueData.byteLength: %u\n", pHeader->keyValueData.byteLength);
    fprintf(stdout, "supercompressionGlobalData.byteOffset: %#" PRIx64 "\n",
            pHeader->supercompressionGlobalData.byteOffset);
    fprintf(stdout, "supercompressionGlobalData.byteLength: %" PRId64 "\n",
            pHeader->supercompressionGlobalData.byteLength);
}